

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverter.h
# Opt level: O0

void __thiscall
Diligent::IHLSL2GLSLConversionStream::IHLSL2GLSLConversionStream(IHLSL2GLSLConversionStream *this)

{
  IHLSL2GLSLConversionStream *this_local;
  
  IObject::IObject(&this->super_IObject);
  (this->super_IObject)._vptr_IObject = (_func_int **)&PTR___cxa_pure_virtual_00594218;
  return;
}

Assistant:

DILIGENT_BEGIN_INTERFACE(IHLSL2GLSLConversionStream, IObject)
{
    VIRTUAL void METHOD(Convert)(THIS_
                                 const Char* EntryPoint,
                                 SHADER_TYPE ShaderType,
                                 bool        IncludeDefintions,
                                 const char* SamplerSuffix,
                                 bool        UseInOutLocationQualifiers,
                                 bool        UseRowMajorMatrices,
                                 IDataBlob** ppGLSLSource) PURE;
}